

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

void __thiscall
crawler::JsonParser::parseLiteralness(JsonParser *this,string *literal,JsonType jsonType)

{
  bool bVar1;
  runtime_error *this_00;
  undefined1 local_48 [8];
  string compareData;
  size_t literalSize;
  JsonType jsonType_local;
  string *literal_local;
  JsonParser *this_local;
  
  compareData.field_2._8_8_ = std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)local_48,(ulong)this);
  bVar1 = std::operator!=(literal,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_48);
  if (!bVar1) {
    this->pos = this->pos + compareData.field_2._8_8_;
    JsonValue::setType(&this->jsonValue,jsonType);
    std::__cxx11::string::~string((string *)local_48);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"PARSE_INVALID_VALUE");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void crawler::JsonParser::parseLiteralness(const std::string &literal,
                                           crawler::JsonType jsonType) {
  size_t literalSize = literal.size();
  std::string compareData = json.substr(pos, literalSize);
  if (literal != compareData) {
    throw std::runtime_error("PARSE_INVALID_VALUE");
  }
  // move `pos` steps forward
  pos += literalSize;
  this->jsonValue.setType(jsonType);
}